

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileRemote.cpp
# Opt level: O3

void __thiscall
adios2::transport::FileRemote::Read(FileRemote *this,char *buffer,size_t size,size_t start)

{
  size_type *psVar1;
  Remote *pRVar2;
  bool bVar3;
  char cVar4;
  undefined8 *puVar5;
  long *plVar6;
  int *piVar7;
  size_t sVar8;
  undefined8 *puVar9;
  long *plVar10;
  ulong *puVar11;
  ulong uVar12;
  char cVar13;
  ulong uVar14;
  string __str;
  string __str_3;
  string __str_2;
  string __str_1;
  string local_1d8;
  ulong *local_1b8;
  long local_1b0;
  ulong local_1a8;
  long lStack_1a0;
  ulong *local_198;
  long local_190;
  ulong local_188;
  long lStack_180;
  undefined8 *local_178;
  undefined8 local_170;
  undefined8 local_168;
  undefined8 uStack_160;
  ulong *local_158;
  long local_150;
  ulong local_148;
  long lStack_140;
  long *local_138;
  long local_130;
  long local_128;
  long lStack_120;
  long *local_118;
  long local_110;
  long local_108;
  long lStack_100;
  string local_f8;
  string local_d8;
  string local_b8;
  ulong *local_98;
  uint local_90;
  undefined4 uStack_8c;
  ulong local_88 [2];
  ulong *local_78;
  uint local_70;
  undefined4 uStack_6c;
  ulong local_68 [2];
  char *local_58;
  char *local_50;
  uint local_48;
  char local_40 [16];
  
  if (start == 0xffffffffffffffff) {
    sVar8 = this->m_SeekPos;
  }
  else {
    if (this->m_Size <= start) {
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Toolkit","");
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d8,"transport::file::FileRemote","");
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"Read","");
      cVar13 = '\x01';
      if (9 < start) {
        sVar8 = start;
        cVar4 = '\x04';
        do {
          cVar13 = cVar4;
          if (sVar8 < 100) {
            cVar13 = cVar13 + -2;
            goto LAB_0064ec7b;
          }
          if (sVar8 < 1000) {
            cVar13 = cVar13 + -1;
            goto LAB_0064ec7b;
          }
          if (sVar8 < 10000) goto LAB_0064ec7b;
          bVar3 = 99999 < sVar8;
          sVar8 = sVar8 / 10000;
          cVar4 = cVar13 + '\x04';
        } while (bVar3);
        cVar13 = cVar13 + '\x01';
      }
LAB_0064ec7b:
      local_198 = &local_188;
      std::__cxx11::string::_M_construct((ulong)&local_198,cVar13);
      std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_198,(uint)local_190,start);
      puVar5 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_198,0,(char *)0x0,0x74daa0)
      ;
      local_178 = &local_168;
      puVar9 = puVar5 + 2;
      if ((undefined8 *)*puVar5 == puVar9) {
        local_168 = *puVar9;
        uStack_160 = puVar5[3];
      }
      else {
        local_168 = *puVar9;
        local_178 = (undefined8 *)*puVar5;
      }
      local_170 = puVar5[1];
      *puVar5 = puVar9;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_178);
      local_138 = &local_128;
      plVar10 = plVar6 + 2;
      if ((long *)*plVar6 == plVar10) {
        local_128 = *plVar10;
        lStack_120 = plVar6[3];
      }
      else {
        local_128 = *plVar10;
        local_138 = (long *)*plVar6;
      }
      local_130 = plVar6[1];
      *plVar6 = (long)plVar10;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_138,
                                  (ulong)(this->super_Transport).m_Name._M_dataplus._M_p);
      local_118 = &local_108;
      plVar10 = plVar6 + 2;
      if ((long *)*plVar6 == plVar10) {
        local_108 = *plVar10;
        lStack_100 = plVar6[3];
      }
      else {
        local_108 = *plVar10;
        local_118 = (long *)*plVar6;
      }
      local_110 = plVar6[1];
      *plVar6 = (long)plVar10;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      local_58 = buffer;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_118);
      puVar11 = (ulong *)(plVar6 + 2);
      if ((ulong *)*plVar6 == puVar11) {
        local_1a8 = *puVar11;
        lStack_1a0 = plVar6[3];
        local_1b8 = &local_1a8;
      }
      else {
        local_1a8 = *puVar11;
        local_1b8 = (ulong *)*plVar6;
      }
      local_1b0 = plVar6[1];
      *plVar6 = (long)puVar11;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      uVar14 = this->m_Size;
      cVar13 = '\x01';
      if (9 < uVar14) {
        uVar12 = uVar14;
        cVar4 = '\x04';
        do {
          cVar13 = cVar4;
          if (uVar12 < 100) {
            cVar13 = cVar13 + -2;
            goto LAB_0064ee8f;
          }
          if (uVar12 < 1000) {
            cVar13 = cVar13 + -1;
            goto LAB_0064ee8f;
          }
          if (uVar12 < 10000) goto LAB_0064ee8f;
          bVar3 = 99999 < uVar12;
          uVar12 = uVar12 / 10000;
          cVar4 = cVar13 + '\x04';
        } while (bVar3);
        cVar13 = cVar13 + '\x01';
      }
LAB_0064ee8f:
      local_158 = &local_148;
      std::__cxx11::string::_M_construct((ulong)&local_158,cVar13);
      std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_158,(uint)local_150,uVar14);
      uVar14 = 0xf;
      if (local_1b8 != &local_1a8) {
        uVar14 = local_1a8;
      }
      if (uVar14 < (ulong)(local_150 + local_1b0)) {
        uVar14 = 0xf;
        if (local_158 != &local_148) {
          uVar14 = local_148;
        }
        if (uVar14 < (ulong)(local_150 + local_1b0)) goto LAB_0064ef0c;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_158,0,(char *)0x0,(ulong)local_1b8);
      }
      else {
LAB_0064ef0c:
        puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1b8,(ulong)local_158);
      }
      local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
      psVar1 = puVar5 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar1) {
        local_1d8.field_2._M_allocated_capacity = *psVar1;
        local_1d8.field_2._8_8_ = puVar5[3];
      }
      else {
        local_1d8.field_2._M_allocated_capacity = *psVar1;
        local_1d8._M_dataplus._M_p = (pointer)*puVar5;
      }
      local_1d8._M_string_length = puVar5[1];
      *puVar5 = psVar1;
      puVar5[1] = 0;
      *(undefined1 *)psVar1 = 0;
      helper::Throw<std::ios_base::failure[abi:cxx11]>(&local_b8,&local_d8,&local_f8,&local_1d8,-1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p);
      }
      if (local_158 != &local_148) {
        operator_delete(local_158);
      }
      if (local_1b8 != &local_1a8) {
        operator_delete(local_1b8);
      }
      buffer = local_58;
      if (local_118 != &local_108) {
        operator_delete(local_118);
      }
      if (local_138 != &local_128) {
        operator_delete(local_138);
      }
      if (local_178 != &local_168) {
        operator_delete(local_178);
      }
      if (local_198 != &local_188) {
        operator_delete(local_198);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p);
      }
    }
    this->m_SeekPos = start;
    piVar7 = __errno_location();
    *piVar7 = 0;
    this->m_Errno = 0;
    sVar8 = start;
  }
  if (sVar8 + size <= this->m_Size) goto LAB_0064f77a;
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Toolkit","");
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d8,"transport::file::FileRemote","");
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"Read","");
  cVar13 = '\x01';
  if (9 < size) {
    sVar8 = size;
    cVar4 = '\x04';
    do {
      cVar13 = cVar4;
      if (sVar8 < 100) {
        cVar13 = cVar13 + -2;
        goto LAB_0064f177;
      }
      if (sVar8 < 1000) {
        cVar13 = cVar13 + -1;
        goto LAB_0064f177;
      }
      if (sVar8 < 10000) goto LAB_0064f177;
      bVar3 = 99999 < sVar8;
      sVar8 = sVar8 / 10000;
      cVar4 = cVar13 + '\x04';
    } while (bVar3);
    cVar13 = cVar13 + '\x01';
  }
LAB_0064f177:
  local_50 = local_40;
  std::__cxx11::string::_M_construct((ulong)&local_50,cVar13);
  std::__detail::__to_chars_10_impl<unsigned_long>(local_50,local_48,size);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x750907);
  local_158 = &local_148;
  puVar11 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar11) {
    local_148 = *puVar11;
    lStack_140 = plVar6[3];
  }
  else {
    local_148 = *puVar11;
    local_158 = (ulong *)*plVar6;
  }
  local_150 = plVar6[1];
  *plVar6 = (long)puVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_158);
  puVar11 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar11) {
    local_188 = *puVar11;
    lStack_180 = plVar6[3];
    local_198 = &local_188;
  }
  else {
    local_188 = *puVar11;
    local_198 = (ulong *)*plVar6;
  }
  local_190 = plVar6[1];
  *plVar6 = (long)puVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  uVar14 = this->m_SeekPos;
  cVar13 = '\x01';
  if (9 < uVar14) {
    uVar12 = uVar14;
    cVar4 = '\x04';
    do {
      cVar13 = cVar4;
      if (uVar12 < 100) {
        cVar13 = cVar13 + -2;
        goto LAB_0064f2cd;
      }
      if (uVar12 < 1000) {
        cVar13 = cVar13 + -1;
        goto LAB_0064f2cd;
      }
      if (uVar12 < 10000) goto LAB_0064f2cd;
      bVar3 = 99999 < uVar12;
      uVar12 = uVar12 / 10000;
      cVar4 = cVar13 + '\x04';
    } while (bVar3);
    cVar13 = cVar13 + '\x01';
  }
LAB_0064f2cd:
  local_78 = local_68;
  std::__cxx11::string::_M_construct((ulong)&local_78,cVar13);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_78,local_70,uVar14);
  uVar14 = CONCAT44(uStack_6c,local_70) + local_190;
  uVar12 = 0xf;
  if (local_198 != &local_188) {
    uVar12 = local_188;
  }
  if (uVar12 < uVar14) {
    uVar12 = 0xf;
    if (local_78 != local_68) {
      uVar12 = local_68[0];
    }
    if (uVar12 < uVar14) goto LAB_0064f352;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,(ulong)local_198);
  }
  else {
LAB_0064f352:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_198,(ulong)local_78);
  }
  local_178 = &local_168;
  puVar9 = puVar5 + 2;
  if ((undefined8 *)*puVar5 == puVar9) {
    local_168 = *puVar9;
    uStack_160 = puVar5[3];
  }
  else {
    local_168 = *puVar9;
    local_178 = (undefined8 *)*puVar5;
  }
  local_170 = puVar5[1];
  *puVar5 = puVar9;
  puVar5[1] = 0;
  *(undefined1 *)puVar9 = 0;
  puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_178);
  local_138 = &local_128;
  plVar6 = puVar5 + 2;
  if ((long *)*puVar5 == plVar6) {
    local_128 = *plVar6;
    lStack_120 = puVar5[3];
  }
  else {
    local_128 = *plVar6;
    local_138 = (long *)*puVar5;
  }
  local_130 = puVar5[1];
  *puVar5 = plVar6;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  puVar5 = (undefined8 *)
           std::__cxx11::string::_M_append
                     ((char *)&local_138,(ulong)(this->super_Transport).m_Name._M_dataplus._M_p);
  local_118 = &local_108;
  plVar6 = puVar5 + 2;
  if ((long *)*puVar5 == plVar6) {
    local_108 = *plVar6;
    lStack_100 = puVar5[3];
  }
  else {
    local_108 = *plVar6;
    local_118 = (long *)*puVar5;
  }
  local_110 = puVar5[1];
  *puVar5 = plVar6;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_118);
  puVar11 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar11) {
    local_1a8 = *puVar11;
    lStack_1a0 = puVar5[3];
    local_1b8 = &local_1a8;
  }
  else {
    local_1a8 = *puVar11;
    local_1b8 = (ulong *)*puVar5;
  }
  local_1b0 = puVar5[1];
  *puVar5 = puVar11;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  uVar14 = this->m_Size;
  cVar13 = '\x01';
  if (9 < uVar14) {
    uVar12 = uVar14;
    cVar4 = '\x04';
    do {
      cVar13 = cVar4;
      if (uVar12 < 100) {
        cVar13 = cVar13 + -2;
        goto LAB_0064f539;
      }
      if (uVar12 < 1000) {
        cVar13 = cVar13 + -1;
        goto LAB_0064f539;
      }
      if (uVar12 < 10000) goto LAB_0064f539;
      bVar3 = 99999 < uVar12;
      uVar12 = uVar12 / 10000;
      cVar4 = cVar13 + '\x04';
    } while (bVar3);
    cVar13 = cVar13 + '\x01';
  }
LAB_0064f539:
  local_98 = local_88;
  std::__cxx11::string::_M_construct((ulong)&local_98,cVar13);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_98,local_90,uVar14);
  uVar14 = CONCAT44(uStack_8c,local_90) + local_1b0;
  uVar12 = 0xf;
  if (local_1b8 != &local_1a8) {
    uVar12 = local_1a8;
  }
  if (uVar12 < uVar14) {
    uVar12 = 0xf;
    if (local_98 != local_88) {
      uVar12 = local_88[0];
    }
    if (uVar12 < uVar14) goto LAB_0064f5be;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,(ulong)local_1b8);
  }
  else {
LAB_0064f5be:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1b8,(ulong)local_98);
  }
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  psVar1 = puVar5 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_1d8.field_2._M_allocated_capacity = *psVar1;
    local_1d8.field_2._8_8_ = puVar5[3];
  }
  else {
    local_1d8.field_2._M_allocated_capacity = *psVar1;
    local_1d8._M_dataplus._M_p = (pointer)*puVar5;
  }
  local_1d8._M_string_length = puVar5[1];
  *puVar5 = psVar1;
  puVar5[1] = 0;
  *(undefined1 *)psVar1 = 0;
  helper::Throw<std::ios_base::failure[abi:cxx11]>(&local_b8,&local_d8,&local_f8,&local_1d8,-1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  if (local_98 != local_88) {
    operator_delete(local_98);
  }
  if (local_1b8 != &local_1a8) {
    operator_delete(local_1b8);
  }
  if (local_118 != &local_108) {
    operator_delete(local_118);
  }
  if (local_138 != &local_128) {
    operator_delete(local_138);
  }
  if (local_178 != &local_168) {
    operator_delete(local_178);
  }
  if (local_78 != local_68) {
    operator_delete(local_78);
  }
  if (local_198 != &local_188) {
    operator_delete(local_198);
  }
  if (local_158 != &local_148) {
    operator_delete(local_158);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
LAB_0064f77a:
  pRVar2 = (this->m_Remote)._M_t.
           super___uniq_ptr_impl<adios2::Remote,_std::default_delete<adios2::Remote>_>._M_t.
           super__Tuple_impl<0UL,_adios2::Remote_*,_std::default_delete<adios2::Remote>_>.
           super__Head_base<0UL,_adios2::Remote_*,_false>._M_head_impl;
  (*pRVar2->_vptr_Remote[7])(pRVar2,start,size,buffer);
  return;
}

Assistant:

void FileRemote::Read(char *buffer, size_t size, size_t start)
{
    WaitForOpen();

    if (start != MaxSizeT)
    {
        if (start >= m_Size)
        {
            helper::Throw<std::ios_base::failure>(
                "Toolkit", "transport::file::FileRemote", "Read",
                "couldn't move to start position " + std::to_string(start) +
                    " beyond the size of " + m_Name + " which is " + std::to_string(m_Size));
        }
        m_SeekPos = start;
        errno = 0;
        m_Errno = errno;
    }

    if (m_SeekPos + size > m_Size)
    {
        helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FileRemote", "Read",
                                              "can't read " + std::to_string(size) +
                                                  " bytes from position " +
                                                  std::to_string(m_SeekPos) + " from " + m_Name +
                                                  " whose size is " + std::to_string(m_Size));
    }

    m_Remote->Read(start, size, buffer);
    if (m_IsCached)
    {
    }
}